

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall aiMesh::~aiMesh(aiMesh *this)

{
  aiBone *this_00;
  aiAnimMesh *this_01;
  aiFace *paVar1;
  aiFace *this_02;
  uint local_20;
  uint local_1c;
  uint a_3;
  uint a_2;
  uint a_1;
  uint a;
  aiMesh *this_local;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  for (a_2 = 0; a_2 < 8; a_2 = a_2 + 1) {
    if (this->mTextureCoords[a_2] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[a_2]);
    }
  }
  for (a_3 = 0; a_3 < 8; a_3 = a_3 + 1) {
    if (this->mColors[a_3] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[a_3]);
    }
  }
  if ((this->mNumBones != 0) && (this->mBones != (aiBone **)0x0)) {
    for (local_1c = 0; local_1c < this->mNumBones; local_1c = local_1c + 1) {
      this_00 = this->mBones[local_1c];
      if (this_00 != (aiBone *)0x0) {
        aiBone::~aiBone(this_00);
        operator_delete(this_00);
      }
    }
    if (this->mBones != (aiBone **)0x0) {
      operator_delete__(this->mBones);
    }
  }
  if ((this->mNumAnimMeshes != 0) && (this->mAnimMeshes != (aiAnimMesh **)0x0)) {
    for (local_20 = 0; local_20 < this->mNumAnimMeshes; local_20 = local_20 + 1) {
      this_01 = this->mAnimMeshes[local_20];
      if (this_01 != (aiAnimMesh *)0x0) {
        aiAnimMesh::~aiAnimMesh(this_01);
        operator_delete(this_01);
      }
    }
    if (this->mAnimMeshes != (aiAnimMesh **)0x0) {
      operator_delete__(this->mAnimMeshes);
    }
  }
  paVar1 = this->mFaces;
  if (paVar1 != (aiFace *)0x0) {
    this_02 = paVar1 + (long)paVar1[-1].mIndices;
    while (paVar1 != this_02) {
      this_02 = this_02 + -1;
      aiFace::~aiFace(this_02);
    }
    operator_delete__(&paVar1[-1].mIndices);
  }
  aiAABB::~aiAABB(&this->mAABB);
  return;
}

Assistant:

~aiMesh() {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }

        // DO NOT REMOVE THIS ADDITIONAL CHECK
        if (mNumBones && mBones)    {
            for( unsigned int a = 0; a < mNumBones; a++) {
                delete mBones[a];
            }
            delete [] mBones;
        }

        if (mNumAnimMeshes && mAnimMeshes)  {
            for( unsigned int a = 0; a < mNumAnimMeshes; a++) {
                delete mAnimMeshes[a];
            }
            delete [] mAnimMeshes;
        }

        delete [] mFaces;
    }